

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O1

int strlen_color(char *argument)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  uint uVar4;
  
  iVar3 = 0;
  if ((argument != (char *)0x0) && (iVar3 = 0, *argument != '\0')) {
    sVar2 = 0;
LAB_002a1c33:
    for (; *argument == '{'; argument = argument + 2) {
      bVar1 = argument[1];
      uVar4 = bVar1 - 0x2d;
      if (uVar4 < 0x3a) {
        if ((0x2200000022087f8U >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
          if ((ulong)uVar4 != 0) goto LAB_002a1c63;
LAB_002a1c6d:
          sVar2 = sVar2 + 1;
        }
      }
      else {
LAB_002a1c63:
        if (bVar1 != 0x6e) {
          if (bVar1 == 0x78) goto LAB_002a1c6d;
          sVar2 = sVar2 + 2;
        }
      }
    }
    if (*argument != '\0') {
      argument = argument + 1;
      sVar2 = sVar2 + 1;
      goto LAB_002a1c33;
    }
    iVar3 = (int)sVar2;
  }
  return iVar3;
}

Assistant:

int strlen_color(char *argument)
{
	char *str;
	short length;

	if (argument == nullptr || argument[0] == '\0')
		return 0;

	length = 0;
	str = argument;

	while (*str != '\0')
	{
		if (*str != '{')
		{
			str++;
			length++;
			continue;
		}

		switch (*(++str))
		{
			case '-':
			case 'x':
				length++;
				break;
			case '<':
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case 'B':
			case 'b':
			case 'F':
			case 'f':
			case 'n':
				break;
			default:
				length += 2;
				break;
		}

		str++;
	}

	return length;
}